

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

string * libcellml::printMapVariables
                   (string *__return_storage_ptr__,VariablePairPtr *variablePair,IdList *idList,
                   bool autoIds)

{
  undefined3 in_register_00000009;
  undefined4 uVar1;
  undefined4 in_register_0000000c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string mappingId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  VariablePair local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  VariablePair local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  string local_68;
  string local_48;
  
  uVar1 = CONCAT31(in_register_00000009,autoIds);
  this = &bStack_108;
  VariablePair::variable1(&local_78);
  NamedEntity::name_abi_cxx11_(&local_48,(NamedEntity *)local_78.mPimpl);
  std::operator+(&local_98,"<map_variables variable_1=\"",&local_48);
  std::operator+(&bStack_108,&local_98,"\"");
  std::operator+(&local_e8,&bStack_108," variable_2=\"");
  VariablePair::variable2(&local_a8);
  NamedEntity::name_abi_cxx11_(&local_68,(NamedEntity *)local_a8.mPimpl);
  std::operator+(&local_c8,&local_e8,&local_68);
  std::operator+(__return_storage_ptr__,&local_c8,"\"");
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&bStack_108);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  VariablePair::variable1((VariablePair *)&local_e8);
  VariablePair::variable2((VariablePair *)&bStack_108);
  Variable::equivalenceMappingId_abi_cxx11_
            (&local_c8,(Variable *)&local_e8,(VariablePtr *)&bStack_108,
             (VariablePtr *)CONCAT44(in_register_0000000c,uVar1));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bStack_108._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_e8._M_string_length);
  if (local_c8._M_string_length == 0) {
    if (!autoIds) goto LAB_00206c51;
    makeUniqueId(&local_98,idList);
    std::operator+(&bStack_108," id=\"",&local_98);
    std::operator+(&local_e8,&bStack_108,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&bStack_108);
    this = &local_98;
  }
  else {
    std::operator+(&bStack_108," id=\"",&local_c8);
    std::operator+(&local_e8,&bStack_108,"\"");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  std::__cxx11::string::~string((string *)this);
LAB_00206c51:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_c8);
  return __return_storage_ptr__;
}

Assistant:

std::string printMapVariables(const VariablePairPtr &variablePair, IdList &idList, bool autoIds)
{
    std::string mapVariables = "<map_variables variable_1=\"" + variablePair->variable1()->name() + "\""
                               + " variable_2=\"" + variablePair->variable2()->name() + "\"";
    std::string mappingId = Variable::equivalenceMappingId(variablePair->variable1(), variablePair->variable2());
    if (!mappingId.empty()) {
        mapVariables += " id=\"" + mappingId + "\"";
    } else if (autoIds) {
        mapVariables += " id=\"" + makeUniqueId(idList) + "\"";
    }
    mapVariables += "/>";
    return mapVariables;
}